

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O3

void __thiscall
CLI::detail::ExistingDirectoryValidator::ExistingDirectoryValidator
          (ExistingDirectoryValidator *this)

{
  anon_class_1_0_00000001 local_39;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"DIR","");
  Validator::Validator(&this->super_Validator,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,&local_39);
  return;
}

Assistant:

ExistingDirectoryValidator() : Validator("DIR") {
        func_ = [](std::string &filename) {
            auto path_result = check_path(filename.c_str());
            if(path_result == path_type::nonexistent) {
                return "Directory does not exist: " + filename;
            }
            if(path_result == path_type::file) {
                return "Directory is actually a file: " + filename;
            }
            return std::string();
        };
    }